

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::JsonReporter::JsonReporter(JsonReporter *this,ReporterConfig *config)

{
  bool bVar1;
  reference pvVar2;
  JsonValueWriter *this_00;
  TestSpec *value;
  undefined8 *in_RDI;
  StringRef SVar3;
  JsonObjectWriter metadata_writer;
  value_type *writer;
  JsonValueWriter *in_stack_fffffffffffff548;
  JsonValueWriter *in_stack_fffffffffffff550;
  ReporterConfig *in_stack_fffffffffffff578;
  StreamingReporterBase *in_stack_fffffffffffff580;
  char *local_a50;
  size_t local_a48;
  JsonObjectWriter local_a40 [17];
  StringRef local_8a8;
  JsonObjectWriter local_898 [17];
  undefined4 local_6fc;
  StringRef local_6f8;
  JsonObjectWriter local_6e8 [17];
  undefined1 local_550 [16];
  StringRef local_540;
  JsonValueWriter local_530;
  StringRef local_398;
  JsonObjectWriter local_388 [17];
  undefined1 local_1f0 [28];
  undefined4 local_1d4;
  StringRef local_1d0;
  JsonObjectWriter local_1c0 [17];
  reference local_28;
  undefined4 local_20;
  
  StreamingReporterBase::StreamingReporterBase(in_stack_fffffffffffff580,in_stack_fffffffffffff578);
  *in_RDI = &PTR__JsonReporter_002a6940;
  Timer::Timer((Timer *)(in_RDI + 0x12));
  std::
  stack<Catch::JsonObjectWriter,std::deque<Catch::JsonObjectWriter,std::allocator<Catch::JsonObjectWriter>>>
  ::stack<std::deque<Catch::JsonObjectWriter,std::allocator<Catch::JsonObjectWriter>>,void>
            ((stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
              *)in_stack_fffffffffffff550);
  std::
  stack<Catch::JsonArrayWriter,std::deque<Catch::JsonArrayWriter,std::allocator<Catch::JsonArrayWriter>>>
  ::stack<std::deque<Catch::JsonArrayWriter,std::allocator<Catch::JsonArrayWriter>>,void>
            ((stack<Catch::JsonArrayWriter,_std::deque<Catch::JsonArrayWriter,_std::allocator<Catch::JsonArrayWriter>_>_>
              *)in_stack_fffffffffffff550);
  std::
  stack<Catch::JsonReporter::Writer,std::deque<Catch::JsonReporter::Writer,std::allocator<Catch::JsonReporter::Writer>>>
  ::stack<std::deque<Catch::JsonReporter::Writer,std::allocator<Catch::JsonReporter::Writer>>,void>
            ((stack<Catch::JsonReporter::Writer,_std::deque<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>_>
              *)in_stack_fffffffffffff550);
  *(undefined1 *)(in_RDI + 0x31) = 0;
  *(undefined1 *)(in_RDI + 1) = 1;
  *(undefined1 *)((long)in_RDI + 9) = 1;
  std::
  stack<Catch::JsonObjectWriter,std::deque<Catch::JsonObjectWriter,std::allocator<Catch::JsonObjectWriter>>>
  ::emplace<std::ostream&>
            ((stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
              *)in_stack_fffffffffffff550,
             (basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffff548);
  local_20 = 0;
  std::
  stack<Catch::JsonReporter::Writer,_std::deque<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>_>
  ::emplace<Catch::JsonReporter::Writer>
            ((stack<Catch::JsonReporter::Writer,_std::deque<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>_>
              *)in_stack_fffffffffffff550,(Writer *)in_stack_fffffffffffff548);
  pvVar2 = std::
           stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
           ::top((stack<Catch::JsonObjectWriter,_std::deque<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>_>
                  *)0x1a2e74);
  local_28 = pvVar2;
  local_1d0 = operator____sr((char *)in_stack_fffffffffffff550,(size_t)in_stack_fffffffffffff548);
  JsonObjectWriter::write(local_1c0,(int)pvVar2,local_1d0.m_start,local_1d0.m_size);
  local_1d4 = 1;
  JsonValueWriter::write<int>(in_stack_fffffffffffff550,(int *)in_stack_fffffffffffff548);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a2f09);
  pvVar2 = local_28;
  local_398 = operator____sr((char *)in_stack_fffffffffffff550,(size_t)in_stack_fffffffffffff548);
  JsonObjectWriter::write(local_388,(int)pvVar2,local_398.m_start,local_398.m_size);
  JsonValueWriter::writeObject(in_stack_fffffffffffff548);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a2f7f);
  local_540 = operator____sr((char *)in_stack_fffffffffffff550,(size_t)in_stack_fffffffffffff548);
  JsonObjectWriter::write
            ((JsonObjectWriter *)&local_530,(int)local_1f0,local_540.m_start,local_540.m_size);
  local_550 = (**(code **)(*(long *)in_RDI[2] + 0x18))();
  JsonValueWriter::write(&local_530,local_550._0_4_,local_550._8_8_,local_550._0_8_);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a302b);
  local_6f8 = operator____sr((char *)in_stack_fffffffffffff550,(size_t)in_stack_fffffffffffff548);
  JsonObjectWriter::write(local_6e8,(int)local_1f0,local_6f8.m_start,local_6f8.m_size);
  local_6fc = (**(code **)(*(long *)in_RDI[2] + 0x88))();
  JsonValueWriter::write<unsigned_int>(in_stack_fffffffffffff550,(uint *)in_stack_fffffffffffff548);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a30bd);
  local_8a8 = operator____sr((char *)in_stack_fffffffffffff550,(size_t)in_stack_fffffffffffff548);
  JsonObjectWriter::write(local_898,(int)local_1f0,local_8a8.m_start,local_8a8.m_size);
  libraryVersion();
  JsonValueWriter::write<Catch::Version>
            (in_stack_fffffffffffff550,(Version *)in_stack_fffffffffffff548);
  JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a3132);
  this_00 = (JsonValueWriter *)(**(code **)(*(long *)in_RDI[2] + 0x68))();
  bVar1 = TestSpec::hasFilters((TestSpec *)0x1a3155);
  if (bVar1) {
    SVar3 = operator____sr((char *)this_00,(size_t)in_stack_fffffffffffff548);
    local_a50 = SVar3.m_start;
    local_a48 = SVar3.m_size;
    JsonObjectWriter::write(local_a40,(int)local_1f0,local_a50,local_a48);
    value = (TestSpec *)(**(code **)(*(long *)in_RDI[2] + 0x68))();
    JsonValueWriter::write<Catch::TestSpec>(this_00,value);
    JsonValueWriter::~JsonValueWriter((JsonValueWriter *)0x1a31c9);
  }
  JsonObjectWriter::~JsonObjectWriter((JsonObjectWriter *)this_00);
  return;
}

Assistant:

JsonReporter::JsonReporter( ReporterConfig&& config ):
        StreamingReporterBase{ CATCH_MOVE( config ) } {

        m_preferences.shouldRedirectStdOut = true;
        // TBD: Do we want to report all assertions? XML reporter does
        //      not, but for machine-parseable reporters I think the answer
        //      should be yes.
        m_preferences.shouldReportAllAssertions = true;

        m_objectWriters.emplace( m_stream );
        m_writers.emplace( Writer::Object );
        auto& writer = m_objectWriters.top();

        writer.write( "version"_sr ).write( 1 );

        {
            auto metadata_writer = writer.write( "metadata"_sr ).writeObject();
            metadata_writer.write( "name"_sr ).write( m_config->name() );
            metadata_writer.write( "rng-seed"_sr ).write( m_config->rngSeed() );
            metadata_writer.write( "catch2-version"_sr )
                .write( libraryVersion() );
            if ( m_config->testSpec().hasFilters() ) {
                metadata_writer.write( "filters"_sr )
                    .write( m_config->testSpec() );
            }
        }
    }